

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakeit.hpp
# Opt level: O2

void __thiscall
fakeit::MethodMockingContext<unsigned_long>::Implementation::setMethodDetails
          (Implementation *this,string *mockName,string *methodName)

{
  Context *pCVar1;
  string local_50 [32];
  string local_30 [32];
  
  pCVar1 = this->_stubbingContext;
  std::__cxx11::string::string(local_30,(string *)mockName);
  std::__cxx11::string::string(local_50,(string *)methodName);
  (*(pCVar1->super_Destructible)._vptr_Destructible[6])(pCVar1,local_30,local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void setMethodDetails(std::string mockName, std::string methodName) {
                getStubbingContext().setMethodDetails(mockName, methodName);
            }